

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

self * __thiscall
boost::python::
class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
::def<bool(StimulationCommand::*)(int)>
          (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,first_type f)

{
  long *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  
  local_70 = &local_90;
  local_90 = 0;
  local_68 = local_28;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_60 = local_68;
  local_58 = local_68;
  detail::
  make_function_aux<bool(StimulationCommand::*)(int),boost::python::default_call_policies,boost::mpl::vector3<bool,StimulationCommand&,int>,mpl_::int_<0>>
            ((detail *)&local_98,f);
  objects::add_to_namespace((object *)this,name,(object *)&local_98,(char *)*local_70);
  *local_98 = *local_98 + -1;
  if (*local_98 == 0) {
    _Py_Dealloc();
  }
  return (self *)this;
}

Assistant:

self& def(char const* name, F f)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name, f, detail::def_helper<char const*>(0), &f);
        return *this;
    }